

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::ReadDependentFile(cmMakefile *this,char *filename,bool noPolicyScope)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  cmListFile listFile;
  IncludeScope incScope;
  string filenametoread;
  allocator local_69;
  string local_68;
  IncludeScope local_48;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"CMAKE_PARENT_LIST_FILE",(allocator *)&local_48);
  std::__cxx11::string::string((string *)&local_68,"CMAKE_CURRENT_LIST_FILE",&local_69);
  pcVar3 = GetDefinition(this,&local_68);
  AddDefinition(this,&local_38,pcVar3);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_68,filename,(allocator *)&local_48);
  pcVar3 = cmState::Snapshot::GetCurrentSourceDirectory(&this->StateSnapshot);
  cmsys::SystemTools::CollapseFullPath(&local_38,&local_68,pcVar3);
  std::__cxx11::string::~string((string *)&local_68);
  IncludeScope::IncludeScope(&local_48,this,&local_38,noPolicyScope);
  local_68._M_dataplus._M_p = (pointer)0x0;
  local_68._M_string_length = 0;
  local_68.field_2._M_allocated_capacity = 0;
  bVar1 = cmListFile::ParseFile((cmListFile *)&local_68,local_38._M_dataplus._M_p,false,this);
  if (bVar1) {
    ReadListFile(this,(cmListFile *)&local_68,&local_38);
    bVar2 = cmSystemTools::GetFatalErrorOccured();
    if (!bVar2) goto LAB_0034f4ca;
  }
  local_48.ReportError = false;
LAB_0034f4ca:
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector
            ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)&local_68);
  IncludeScope::~IncludeScope(&local_48);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

bool cmMakefile::ReadDependentFile(const char* filename, bool noPolicyScope)
{
  this->AddDefinition("CMAKE_PARENT_LIST_FILE",
                      this->GetDefinition("CMAKE_CURRENT_LIST_FILE"));
  std::string filenametoread =
    cmSystemTools::CollapseFullPath(filename,
                                    this->GetCurrentSourceDirectory());

  IncludeScope incScope(this, filenametoread, noPolicyScope);

  cmListFile listFile;
  if (!listFile.ParseFile(filenametoread.c_str(), false, this))
    {
    incScope.Quiet();
    return false;
    }
  this->ReadListFile(listFile, filenametoread);
  if(cmSystemTools::GetFatalErrorOccured())
    {
    incScope.Quiet();
    }
  return true;
}